

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_ModelSet_get_gv_flag(HTS_ModelSet *ms,char *string)

{
  char *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  HTS_Boolean HVar1;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    HVar1 = '\x01';
  }
  else {
    HVar1 = HTS_Question_match((HTS_Question *)
                               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI)
    ;
    if (HVar1 == '\x01') {
      HVar1 = '\0';
    }
    else {
      HVar1 = '\x01';
    }
  }
  return HVar1;
}

Assistant:

HTS_Boolean HTS_ModelSet_get_gv_flag(HTS_ModelSet * ms, const char *string)
{
   if (ms->gv_off_context == NULL)
      return TRUE;
   else if (HTS_Question_match(ms->gv_off_context, string) == TRUE)
      return FALSE;
   else
      return TRUE;
}